

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,read_slot_1>
          (xr_reader *this,
          vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>> *container)

{
  uint32_t id;
  uint32_t id_00;
  xr_reader *s;
  read_slot_1 local_41;
  xr_reader *local_40;
  wm_slot_le *local_38;
  
  id_00 = 0;
  while( true ) {
    local_40 = open_chunk(this,id_00);
    if (local_40 == (xr_reader *)0x0) break;
    local_38 = (wm_slot_le *)0x0;
    std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>::
    emplace_back<xray_re::wm_slot_le*>(container,&local_38);
    read_slot_1::operator()(&local_41,(wm_slot_le **)(*(long *)(container + 8) + -8),local_40);
    close_chunk(this,&local_40);
    id_00 = id_00 + 1;
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}